

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O0

void __thiscall
jsoncons::jsonschema::
properties_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
update_patch(properties_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
             *this,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *patch,
            json_pointer *instance_location,
            basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *default_value)

{
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> j;
  basic_json_pointer<char> *in_stack_ffffffffffffff08;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  char *__str;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  string local_98 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  string_view_type *in_stack_ffffffffffffffa8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  char local_30 [48];
  
  __str = local_30;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
            (in_stack_ffffffffffffff10);
  this_00 = &local_40;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,__str);
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::try_emplace<char_const(&)[4]>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (char (*) [4])in_stack_ffffffffffffffa0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,__str);
  jsonpointer::basic_json_pointer<char>::string_abi_cxx11_(in_stack_ffffffffffffff08);
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::try_emplace<std::__cxx11::string>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string(local_98);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,__str);
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
  try_emplace<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             in_stack_ffffffffffffffa0);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::push_back
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x856e30);
  return;
}

Assistant:

void update_patch(Json& patch, const jsonpointer::json_pointer& instance_location, Json&& default_value) const
        {
            Json j;
            j.try_emplace("op", "add"); 
            j.try_emplace("path", instance_location.string()); 
            j.try_emplace("value", std::forward<Json>(default_value)); 
            patch.push_back(std::move(j));
        }